

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O2

void __thiscall ipx::Iterate::Iterate(Iterate *this,Model *model)

{
  double *pdVar1;
  double *pdVar2;
  pointer pSVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t __n;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  this->model_ = model;
  memset(&this->x_,0,0x102);
  this->feasibility_tol_ = 1e-06;
  this->optimality_tol_ = 1e-08;
  this->start_crossover_tol_ = -1.0;
  __n = (size_t)model->num_rows_;
  uVar10 = (long)model->num_cols_ + __n;
  std::valarray<double>::resize(&this->x_,uVar10,0.0);
  std::valarray<double>::resize(&this->xl_,uVar10,0.0);
  std::valarray<double>::resize(&this->xu_,uVar10,0.0);
  std::valarray<double>::resize(&this->y_,__n,0.0);
  std::valarray<double>::resize(&this->zl_,uVar10,0.0);
  std::valarray<double>::resize(&this->zu_,uVar10,0.0);
  std::valarray<double>::resize(&this->rb_,__n,0.0);
  std::valarray<double>::resize(&this->rl_,uVar10,0.0);
  std::valarray<double>::resize(&this->ru_,uVar10,0.0);
  std::valarray<double>::resize(&this->rc_,uVar10,0.0);
  std::vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::resize
            (&this->variable_state_,uVar10);
  pdVar1 = (model->lb_)._M_data;
  pdVar2 = (model->ub_)._M_data;
  pSVar3 = (this->variable_state_).
           super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (this->xl_)._M_data;
  pdVar5 = (this->xu_)._M_data;
  pdVar6 = (this->zl_)._M_data;
  pdVar7 = (this->zu_)._M_data;
  uVar12 = 0;
  uVar11 = uVar10 & 0xffffffff;
  if ((int)uVar10 < 1) {
    uVar11 = uVar12;
  }
  uVar13 = 0x3ff00000;
  for (; uVar11 << 2 != uVar12; uVar12 = uVar12 + 4) {
    uVar10 = *(ulong *)((long)pdVar2 + uVar12 * 2) & 0x7fffffffffffffff;
    uVar14 = uVar13;
    uVar9 = uVar13;
    if (0x7fefffffffffffff < uVar10) {
      uVar14 = 0;
      uVar9 = 0x7ff00000;
    }
    iVar8 = (uint)(uVar10 < 0x7ff0000000000000) * 2;
    uVar15 = uVar13;
    uVar16 = uVar13;
    if (0x7fefffffffffffff < (*(ulong *)((long)pdVar1 + uVar12 * 2) & 0x7fffffffffffffff)) {
      uVar15 = 0x7ff00000;
      uVar16 = 0;
      iVar8 = (uint)(0x7fefffffffffffff < uVar10) * 2 + 1;
    }
    *(int *)((long)pSVar3 + uVar12) = iVar8;
    *(ulong *)((long)pdVar4 + uVar12 * 2) = (ulong)uVar15 << 0x20;
    *(ulong *)((long)pdVar5 + uVar12 * 2) = (ulong)uVar9 << 0x20;
    *(ulong *)((long)pdVar6 + uVar12 * 2) = (ulong)uVar16 << 0x20;
    *(ulong *)((long)pdVar7 + uVar12 * 2) = (ulong)uVar14 << 0x20;
  }
  return;
}

Assistant:

Iterate::Iterate(const Model& model) : model_(model) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    x_.resize(n+m);
    xl_.resize(n+m);
    xu_.resize(n+m);
    y_.resize(m);
    zl_.resize(n+m);
    zu_.resize(n+m);
    rb_.resize(m);
    rl_.resize(n+m);
    ru_.resize(n+m);
    rc_.resize(n+m);
    variable_state_.resize(n+m);

    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j]) && std::isfinite(ub[j])) {
            variable_state_[j] = StateDetail::BARRIER_BOXED;
            xl_[j] = 1.0;
            xu_[j] = 1.0;
            zl_[j] = 1.0;
            zu_[j] = 1.0;
        } else if (std::isfinite(lb[j])) {
            variable_state_[j] = StateDetail::BARRIER_LB;
            xl_[j] = 1.0;
            xu_[j] = INFINITY;
            zl_[j] = 1.0;
            zu_[j] = 0.0;
        } else if (std::isfinite(ub[j])) {
            variable_state_[j] = StateDetail::BARRIER_UB;
            xl_[j] = INFINITY;
            xu_[j] = 1.0;
            zl_[j] = 0.0;
            zu_[j] = 1.0;
        } else {
            variable_state_[j] = StateDetail::FREE;
            xl_[j] = INFINITY;
            xu_[j] = INFINITY;
            zl_[j] = 0.0;
            zu_[j] = 0.0;
        }
    }
    assert_consistency();
}